

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::EmitBrTable(WasmBytecodeGenerator *this)

{
  uint32 relativeDepth;
  EmitInfo EVar1;
  bool bVar2;
  WasmBinaryReader *pWVar3;
  BlockInfo *other;
  WasmCompilationException *this_00;
  ulong uVar4;
  PolymorphicEmitInfo PVar5;
  PolymorphicEmitInfo polyExpr;
  PolymorphicEmitInfo polyExpr_00;
  PolymorphicEmitInfo local_70;
  PolymorphicEmitInfo local_60;
  ulong local_50;
  uint32 *local_48;
  EmitInfo local_40;
  EmitInfo scrutineeInfo;
  
  pWVar3 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar3 == (WasmBinaryReader *)0x0) {
    pWVar3 = (this->m_module->m_reader).ptr;
  }
  local_50 = (ulong)(pWVar3->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  local_48 = (pWVar3->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
  relativeDepth = (pWVar3->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
  PolymorphicEmitInfo::PolymorphicEmitInfo(&local_70,(EmitInfo)0x1ffffffff);
  PVar5._4_4_ = 0;
  PVar5.count = local_70.count;
  PVar5.field_1.singleInfo = local_70.field_1.singleInfo;
  PVar5 = PopStackPolymorphic(this,PVar5,L"br_table expression must be of type i32");
  local_60.field_1 = PVar5.field_1;
  local_60.count = PVar5.count;
  local_40 = PolymorphicEmitInfo::GetInfo(&local_60,0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,0x29,(ulong)local_40 & 0xffffffff,(ulong)local_40 & 0xffffffff);
  local_60.count = 0;
  local_60.field_1.infos = (EmitInfo *)0x0;
  scrutineeInfo = (EmitInfo)GetBlockInfo(this,relativeDepth);
  if (((PolymorphicEmitInfo *)((long)scrutineeInfo + 0x10))->count == 0) {
    PVar5 = (PolymorphicEmitInfo)ZEXT816(0);
  }
  else {
    PVar5 = PopStackPolymorphic(this,(BlockInfo *)scrutineeInfo,(char16 *)0x0);
    local_60.field_1 = PVar5.field_1;
    local_60.count = PVar5.count;
  }
  uVar4 = 0;
  while( true ) {
    EVar1 = scrutineeInfo;
    if (local_50 == uVar4) {
      polyExpr_00._4_4_ = 0;
      polyExpr_00.count = local_60.count;
      polyExpr_00.field_1.singleInfo = local_60.field_1.singleInfo;
      YieldToBlock(this,(BlockInfo *)scrutineeInfo,polyExpr_00);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
                (this->m_writer,(ulong)*(uint *)((long)EVar1 + 0x24),0x2a);
      ReleaseLocation(this,&local_40);
      ReleaseLocation(this,&local_60);
      SetUnreachableState(this,true);
      return;
    }
    other = GetBlockInfo(this,local_48[uVar4]);
    bVar2 = BlockInfo::IsEquivalent((BlockInfo *)scrutineeInfo,other);
    if (!bVar2) break;
    polyExpr._0_8_ = PVar5._0_8_ & 0xffffffff;
    polyExpr.field_1.singleInfo = PVar5.field_1.singleInfo;
    YieldToBlock(this,other,polyExpr);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1b])
              (this->m_writer,0x2c,(ulong)(uint)other->label,(ulong)local_40 & 0xffffffff,
               uVar4 & 0xffffffff);
    uVar4 = uVar4 + 1;
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_00,L"br_table target %u signature mismatch");
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmBytecodeGenerator::EmitBrTable()
{
    const uint32 numTargets = GetReader()->m_currentNode.brTable.numTargets;
    const uint32* targetTable = GetReader()->m_currentNode.brTable.targetTable;
    const uint32 defaultEntry = GetReader()->m_currentNode.brTable.defaultTarget;

    // Compile scrutinee
    EmitInfo scrutineeInfo = PopStackPolymorphic(EmitInfo(WasmTypes::I32), _u("br_table expression must be of type i32")).GetInfo(0);

    m_writer->AsmReg2(Js::OpCodeAsmJs::BeginSwitch_Int, scrutineeInfo.location, scrutineeInfo.location);
    PolymorphicEmitInfo yieldValue;
    BlockInfo* defaultBlockInfo = GetBlockInfo(defaultEntry);
    if (defaultBlockInfo->HasYield())
    {
        yieldValue = PopStackPolymorphic(defaultBlockInfo);
    }

    // Compile cases
    for (uint32 i = 0; i < numTargets; i++)
    {
        uint32 target = targetTable[i];
        BlockInfo* blockInfo = GetBlockInfo(target);
        if (!defaultBlockInfo->IsEquivalent(blockInfo))
        {
            throw WasmCompilationException(_u("br_table target %u signature mismatch"));
        }
        YieldToBlock(blockInfo, yieldValue);
        m_writer->AsmBrReg1Const1(Js::OpCodeAsmJs::Case_IntConst, blockInfo->label, scrutineeInfo.location, i);
    }

    YieldToBlock(defaultBlockInfo, yieldValue);
    m_writer->AsmBr(defaultBlockInfo->label, Js::OpCodeAsmJs::EndSwitch_Int);
    ReleaseLocation(&scrutineeInfo);
    ReleaseLocation(&yieldValue);

    SetUnreachableState(true);
}